

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void ar_exec(ar_object obj,double *inp)

{
  int iVar1;
  double *hess_00;
  double dVar2;
  double dVar3;
  int cssml;
  double *hess;
  double loglik;
  int N;
  int p;
  double *inp_local;
  ar_object obj_local;
  
  loglik._0_4_ = obj->N;
  _N = inp;
  inp_local = (double *)obj;
  iVar1 = ar_estimate(inp,loglik._0_4_,obj->method);
  *(int *)((long)inp_local + 0xc) = iVar1;
  loglik._4_4_ = *(int *)((long)inp_local + 0xc);
  if (*(int *)((long)inp_local + 4) == 2) {
    hess_00 = (double *)malloc((long)(loglik._4_4_ + 1) * 8 * (long)(loglik._4_4_ + 1));
    iVar1 = as154(_N,*(int *)inp_local,*(int *)(inp_local + 1),*(int *)((long)inp_local + 0xc),0,0,
                  inp_local + 9,(double *)0x0,inp_local + 5,inp_local + 6,
                  inp_local + (long)loglik._4_4_ + 9,(double *)&hess,hess_00,0);
    *(int *)(inp_local + 8) = iVar1;
    dVar2 = (double)loglik._0_4_;
    dVar3 = log(6.28318);
    hess = (double *)(dVar2 * ((double)hess + (double)hess + 1.0 + dVar3) * -0.5);
    inp_local[7] = ((double)(*(int *)((long)inp_local + 0xc) + 1) * 2.0 -
                   ((double)hess + (double)hess)) + 2.0;
    free(hess_00);
  }
  else if (*(int *)((long)inp_local + 4) == 0) {
    dVar2 = mean(_N,loglik._0_4_);
    inp_local[5] = dVar2;
    ywalg2(_N,loglik._0_4_,loglik._4_4_,inp_local + 9,inp_local + 6);
  }
  else if (*(int *)((long)inp_local + 4) == 1) {
    dVar2 = mean(_N,loglik._0_4_);
    inp_local[5] = dVar2;
    burgalg(_N,loglik._0_4_ + -1,loglik._4_4_,inp_local + 9,inp_local + 6);
  }
  *(undefined4 *)(inp_local + 2) = *(undefined4 *)((long)inp_local + 0xc);
  return;
}

Assistant:

void ar_exec(ar_object obj, double *inp) {
	int p, N;
	double loglik;
	double *hess;
	N = obj->N;

	obj->p = ar_estimate(inp, N, obj->method);
	//printf("\n p %d \n", obj->p);
	p = obj->p;
	int cssml = 0;

	if (obj->method == 2) {
		hess = (double*)malloc(sizeof(double)* (p + 1) * (p + 1));
		obj->retval = as154(inp, obj->N, obj->optmethod, obj->p, 0, 0 , obj->params, NULL, &obj->mean, &obj->var, obj->params + p, &loglik,
			hess,cssml);
		loglik = -0.5 * (N * (2 * loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * loglik + 2.0 * (obj->p + 1) + 2.0;
		free(hess);
	}
	else if (obj->method == 0) {
		obj->mean = mean(inp, N);
		ywalg2(inp, N, p, obj->params, &obj->var);
	}
	else if (obj->method == 1) {
		obj->mean = mean(inp, N);
		burgalg(inp, N - 1, p, obj->params, &obj->var);
	}

	obj->order = obj->p;


}